

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall
llvm::DWARFVerifier::verifyAbbrevSection(DWARFVerifier *this,DWARFDebugAbbrev *Abbrev)

{
  pointer pDVar1;
  undefined8 uVar2;
  uint uVar3;
  DWARFAbbreviationDeclarationSet *pDVar4;
  raw_ostream *prVar5;
  pointer pDVar6;
  undefined1 in_R8B;
  ulong uVar7;
  long lVar8;
  uint Attribute;
  StringRef Str;
  StringRef SVar9;
  undefined1 local_128 [8];
  DWARFAbbreviationDeclaration AbbrDecl;
  char local_78;
  undefined1 local_70 [8];
  SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_> AttributeSet;
  DenseSetEmpty local_33;
  ushort local_32 [3];
  DenseSetEmpty Empty;
  
  if (Abbrev == (DWARFDebugAbbrev *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    pDVar4 = DWARFDebugAbbrev::getAbbreviationDeclarationSet(Abbrev,0);
    pDVar6 = (pDVar4->Decls).
             super__Vector_base<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar1 = (pDVar4->Decls).
             super__Vector_base<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pDVar6 != pDVar1) {
      uVar3 = 0;
      do {
        local_128._0_4_ = pDVar6->Code;
        local_128._4_2_ = pDVar6->Tag;
        local_128[6] = pDVar6->CodeByteSize;
        local_128[7] = pDVar6->HasChildren;
        SmallVector<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_8U>::SmallVector
                  ((SmallVector<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_8U> *)&AbbrDecl,
                   &pDVar6->AttributeSpecs);
        AbbrDecl.AttributeSpecs.
        super_SmallVectorStorage<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_8U>.InlineElts
        [7].buffer._8_8_ = (pDVar6->FixedAttributeSize).Storage;
        local_70[0] = (DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                       )((byte)local_70[0] | 1);
        DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
        ::initEmpty((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                     *)local_70);
        uVar2 = AbbrDecl._0_8_;
        uVar7 = (ulong)(uint)AbbrDecl.AttributeSpecs.
                             super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>
                             .
                             super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                             .
                             super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                             .super_SmallVectorBase.BeginX;
        AttributeSet.
        super_DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
        .TheMap.storage.buffer._8_8_ = pDVar6;
        if (uVar7 != 0) {
          lVar8 = 0;
          do {
            local_32[0] = *(ushort *)(uVar2 + lVar8);
            Attribute = (uint)local_32[0];
            DenseMapBase<llvm::SmallDenseMap<unsigned_short,llvm::detail::DenseSetEmpty,4u,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>>,unsigned_short,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>>
            ::try_emplace<llvm::detail::DenseSetEmpty&>
                      ((pair<llvm::DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>,_bool>
                        *)&AbbrDecl.FixedAttributeSize,local_70,local_32,&local_33);
            if (local_78 == '\0') {
              prVar5 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              SVar9.Length = 0x2b;
              SVar9.Data = "Abbreviation declaration contains multiple ";
              prVar5 = raw_ostream::operator<<(prVar5,SVar9);
              SVar9 = dwarf::AttributeString(Attribute);
              prVar5 = raw_ostream::operator<<(prVar5,SVar9);
              Str.Length = 0xd;
              Str.Data = " attributes.\n";
              raw_ostream::operator<<(prVar5,Str);
              DWARFAbbreviationDeclaration::dump((DWARFAbbreviationDeclaration *)local_128,this->OS)
              ;
              uVar3 = uVar3 + 1;
            }
            lVar8 = lVar8 + 0x10;
          } while (uVar7 << 4 != lVar8);
        }
        SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
        ::deallocateBuckets((SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                             *)local_70);
        uVar2 = AttributeSet.
                super_DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
                .TheMap.storage.buffer._8_8_;
        if ((uint *)AbbrDecl._0_8_ !=
            &AbbrDecl.AttributeSpecs.
             super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
             super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>.
             super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
             .super_SmallVectorBase.Size) {
          free((void *)AbbrDecl._0_8_);
        }
        pDVar6 = (pointer)(uVar2 + 0xa0);
      } while (pDVar6 != pDVar1);
    }
  }
  return uVar3;
}

Assistant:

unsigned DWARFVerifier::verifyAbbrevSection(const DWARFDebugAbbrev *Abbrev) {
  unsigned NumErrors = 0;
  if (Abbrev) {
    const DWARFAbbreviationDeclarationSet *AbbrDecls =
        Abbrev->getAbbreviationDeclarationSet(0);
    for (auto AbbrDecl : *AbbrDecls) {
      SmallDenseSet<uint16_t> AttributeSet;
      for (auto Attribute : AbbrDecl.attributes()) {
        auto Result = AttributeSet.insert(Attribute.Attr);
        if (!Result.second) {
          error() << "Abbreviation declaration contains multiple "
                  << AttributeString(Attribute.Attr) << " attributes.\n";
          AbbrDecl.dump(OS);
          ++NumErrors;
        }
      }
    }
  }
  return NumErrors;
}